

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int __thiscall Fl_X::set_cursor(Fl_X *this,Fl_Cursor c)

{
  Cursor local_28;
  Cursor xc;
  Fl_Cursor c_local;
  Fl_X *this_local;
  
  switch(c) {
  case FL_CURSOR_SW:
    if (set_cursor::xc_sw == 0) {
      set_cursor::xc_sw = XCreateFontCursor(fl_display,0xc);
    }
    local_28 = set_cursor::xc_sw;
    break;
  case FL_CURSOR_SE:
    if (set_cursor::xc_se == 0) {
      set_cursor::xc_se = XCreateFontCursor(fl_display,0xe);
    }
    local_28 = set_cursor::xc_se;
    break;
  case FL_CURSOR_S:
    if (set_cursor::xc_s == 0) {
      set_cursor::xc_s = XCreateFontCursor(fl_display,0x10);
    }
    local_28 = set_cursor::xc_s;
    break;
  default:
    return 0;
  case FL_CURSOR_MOVE:
    if (set_cursor::xc_move == 0) {
      set_cursor::xc_move = XCreateFontCursor(fl_display,0x34);
    }
    local_28 = set_cursor::xc_move;
    break;
  case FL_CURSOR_HAND:
    if (set_cursor::xc_hand == 0) {
      set_cursor::xc_hand = XCreateFontCursor(fl_display,0x3c);
    }
    local_28 = set_cursor::xc_hand;
    break;
  case FL_CURSOR_ARROW:
    if (set_cursor::xc_arrow == 0) {
      set_cursor::xc_arrow = XCreateFontCursor(fl_display,0x44);
    }
    local_28 = set_cursor::xc_arrow;
    break;
  case FL_CURSOR_W:
    if (set_cursor::xc_w == 0) {
      set_cursor::xc_w = XCreateFontCursor(fl_display,0x46);
    }
    local_28 = set_cursor::xc_w;
    break;
  case FL_CURSOR_HELP:
    if (set_cursor::xc_help == 0) {
      set_cursor::xc_help = XCreateFontCursor(fl_display,0x5c);
    }
    local_28 = set_cursor::xc_help;
    break;
  case FL_CURSOR_E:
    if (set_cursor::xc_e == 0) {
      set_cursor::xc_e = XCreateFontCursor(fl_display,0x60);
    }
    local_28 = set_cursor::xc_e;
    break;
  case FL_CURSOR_CROSS:
    if (set_cursor::xc_cross == 0) {
      set_cursor::xc_cross = XCreateFontCursor(fl_display,0x82);
    }
    local_28 = set_cursor::xc_cross;
    break;
  case FL_CURSOR_NW:
    if (set_cursor::xc_nw == 0) {
      set_cursor::xc_nw = XCreateFontCursor(fl_display,0x86);
    }
    local_28 = set_cursor::xc_nw;
    break;
  case FL_CURSOR_NE:
    if (set_cursor::xc_ne == 0) {
      set_cursor::xc_ne = XCreateFontCursor(fl_display,0x88);
    }
    local_28 = set_cursor::xc_ne;
    break;
  case FL_CURSOR_N:
    if (set_cursor::xc_n == 0) {
      set_cursor::xc_n = XCreateFontCursor(fl_display,0x8a);
    }
    local_28 = set_cursor::xc_n;
    break;
  case FL_CURSOR_WAIT:
    if (set_cursor::xc_wait == 0) {
      set_cursor::xc_wait = XCreateFontCursor(fl_display,0x96);
    }
    local_28 = set_cursor::xc_wait;
    break;
  case FL_CURSOR_INSERT:
    if (set_cursor::xc_insert == 0) {
      set_cursor::xc_insert = XCreateFontCursor(fl_display,0x98);
    }
    local_28 = set_cursor::xc_insert;
    break;
  case FL_CURSOR_NS:
    if (set_cursor::xc_ns == 0) {
      set_cursor::xc_ns = XCreateFontCursor(fl_display,0x74);
    }
    local_28 = set_cursor::xc_ns;
    break;
  case FL_CURSOR_WE:
    if (set_cursor::xc_we == 0) {
      set_cursor::xc_we = XCreateFontCursor(fl_display,0x6c);
    }
    local_28 = set_cursor::xc_we;
  }
  XDefineCursor(fl_display,this->xid,local_28);
  return 1;
}

Assistant:

int Fl_X::set_cursor(Fl_Cursor c) {

  /* The cursors are cached, because creating one takes 0.5ms including
     opening, reading, and closing theme files. They are kept until program
     exit by design, which valgrind will note as reachable. */
  static Cursor xc_arrow = None;
  static Cursor xc_cross = None;
  static Cursor xc_wait = None;
  static Cursor xc_insert = None;
  static Cursor xc_hand = None;
  static Cursor xc_help = None;
  static Cursor xc_move = None;
  static Cursor xc_ns = None;
  static Cursor xc_we = None;
  static Cursor xc_ne = None;
  static Cursor xc_n = None;
  static Cursor xc_nw = None;
  static Cursor xc_e = None;
  static Cursor xc_w = None;
  static Cursor xc_se = None;
  static Cursor xc_s = None;
  static Cursor xc_sw = None;

  Cursor xc;

#define cache_cursor(name, var) if (var == None) { \
                                  var = XCreateFontCursor(fl_display, name); \
                                } \
                                xc = var

  switch (c) {
  case FL_CURSOR_ARROW:   cache_cursor(XC_left_ptr, xc_arrow); break;
  case FL_CURSOR_CROSS:   cache_cursor(XC_tcross, xc_cross); break;
  case FL_CURSOR_WAIT:    cache_cursor(XC_watch, xc_wait); break;
  case FL_CURSOR_INSERT:  cache_cursor(XC_xterm, xc_insert); break;
  case FL_CURSOR_HAND:    cache_cursor(XC_hand2, xc_hand); break;
  case FL_CURSOR_HELP:    cache_cursor(XC_question_arrow, xc_help); break;
  case FL_CURSOR_MOVE:    cache_cursor(XC_fleur, xc_move); break;
  case FL_CURSOR_NS:      cache_cursor(XC_sb_v_double_arrow, xc_ns); break;
  case FL_CURSOR_WE:      cache_cursor(XC_sb_h_double_arrow, xc_we); break;
  case FL_CURSOR_NE:      cache_cursor(XC_top_right_corner, xc_ne); break;
  case FL_CURSOR_N:       cache_cursor(XC_top_side, xc_n); break;
  case FL_CURSOR_NW:      cache_cursor(XC_top_left_corner, xc_nw); break;
  case FL_CURSOR_E:       cache_cursor(XC_right_side, xc_e); break;
  case FL_CURSOR_W:       cache_cursor(XC_left_side, xc_w); break;
  case FL_CURSOR_SE:      cache_cursor(XC_bottom_right_corner, xc_se); break;
  case FL_CURSOR_S:       cache_cursor(XC_bottom_side, xc_s); break;
  case FL_CURSOR_SW:      cache_cursor(XC_bottom_left_corner, xc_sw); break;
  default:
    return 0;
  }

#undef cache_cursor

  XDefineCursor(fl_display, xid, xc);

  return 1;
}